

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O0

void __thiscall
btAlignedObjectArray<btTypedConstraint_*>::quickSortInternal<btSortConstraintOnIslandPredicate>
          (btAlignedObjectArray<btTypedConstraint_*> *this,
          btSortConstraintOnIslandPredicate *CompareFunc,int lo,int hi)

{
  bool bVar1;
  int in_ECX;
  int in_EDX;
  btAlignedObjectArray<btTypedConstraint_*> *in_RSI;
  btAlignedObjectArray<btTypedConstraint_*> *in_RDI;
  btTypedConstraint *x;
  int j;
  int i;
  btTypedConstraint *rhs;
  btTypedConstraint *lhs;
  int iVar2;
  int iVar3;
  
  rhs = (btTypedConstraint *)in_RDI->m_data;
  lhs = (btTypedConstraint *)(&rhs->_vptr_btTypedConstraint)[(in_EDX + in_ECX) / 2];
  iVar2 = in_ECX;
  iVar3 = in_EDX;
  do {
    while (bVar1 = btSortConstraintOnIslandPredicate::operator()
                             ((btSortConstraintOnIslandPredicate *)CONCAT44(in_EDX,in_ECX),lhs,rhs),
          bVar1) {
      in_EDX = in_EDX + 1;
    }
    while (bVar1 = btSortConstraintOnIslandPredicate::operator()
                             ((btSortConstraintOnIslandPredicate *)CONCAT44(in_EDX,in_ECX),lhs,rhs),
          bVar1) {
      in_ECX = in_ECX + -1;
    }
    if (in_EDX <= in_ECX) {
      swap(in_RDI,in_EDX,in_ECX);
      in_EDX = in_EDX + 1;
      in_ECX = in_ECX + -1;
    }
  } while (in_EDX <= in_ECX);
  if (iVar3 < in_ECX) {
    quickSortInternal<btSortConstraintOnIslandPredicate>
              (in_RSI,(btSortConstraintOnIslandPredicate *)CONCAT44(iVar3,iVar2),in_EDX,in_ECX);
  }
  if (in_EDX < iVar2) {
    quickSortInternal<btSortConstraintOnIslandPredicate>
              (in_RSI,(btSortConstraintOnIslandPredicate *)CONCAT44(iVar3,iVar2),in_EDX,in_ECX);
  }
  return;
}

Assistant:

void quickSortInternal(const L& CompareFunc,int lo, int hi)
		{
		//  lo is the lower index, hi is the upper index
		//  of the region of array a that is to be sorted
			int i=lo, j=hi;
			T x=m_data[(lo+hi)/2];

			//  partition
			do
			{    
				while (CompareFunc(m_data[i],x)) 
					i++; 
				while (CompareFunc(x,m_data[j])) 
					j--;
				if (i<=j)
				{
					swap(i,j);
					i++; j--;
				}
			} while (i<=j);

			//  recursion
			if (lo<j) 
				quickSortInternal( CompareFunc, lo, j);
			if (i<hi) 
				quickSortInternal( CompareFunc, i, hi);
		}